

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O3

infinite_counter<unsigned_long,_18446744073709551615UL> * __thiscall
cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
          (infinite_counter<unsigned_long,_18446744073709551615UL> *this)

{
  iterator __position;
  unsigned_long local_18;
  
  __position._M_current =
       (this->count_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current[-1] == 0xffffffffffffffff) {
    local_18 = 0;
    if (__position._M_current ==
        (this->count_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->count_,__position,&local_18);
    }
    else {
      *__position._M_current = 0;
      (this->count_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    __position._M_current[-1] = __position._M_current[-1] + 1;
  }
  return this;
}

Assistant:

infinite_counter& operator++() {
        if (count_.back() == max)
            count_.push_back(0);
        else
            ++count_.back();
        return *this;
    }